

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::calculateabovepoint
          (tetgenmesh *this,arraypool *facpoints,point *ppa,point *ppb,point *ppc)

{
  point pa;
  double *pdVar1;
  point pdVar2;
  bool bVar3;
  double *pb;
  tetgenmesh *this_00;
  long lVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  point *local_38;
  
  pa = *(point *)*facpoints->toparray;
  if (facpoints->objects < 2) {
    pb = (point)0x0;
    dVar6 = 0.0;
    this_00 = this;
  }
  else {
    this_00 = (tetgenmesh *)(long)facpoints->objectbytes;
    lVar4 = 1;
    pb = (double *)0x0;
    dVar7 = 0.0;
    do {
      pdVar5 = *(double **)
                (facpoints->toparray[(uint)lVar4 >> ((byte)facpoints->log2objectsperblock & 0x1f)] +
                (long)(int)((uint)lVar4 & facpoints->objectsperblockmark) * (long)this_00);
      dVar6 = (pdVar5[2] - pa[2]) * (pdVar5[2] - pa[2]) +
              (*pdVar5 - *pa) * (*pdVar5 - *pa) + (pdVar5[1] - pa[1]) * (pdVar5[1] - pa[1]);
      if (dVar6 <= dVar7) {
        dVar6 = dVar7;
        pdVar5 = pb;
      }
      pb = pdVar5;
      lVar4 = lVar4 + 1;
      dVar7 = dVar6;
    } while (facpoints->objects != lVar4);
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    if (facpoints->objects < 2) {
      bVar3 = true;
      pdVar5 = (point)0x0;
    }
    else {
      dVar8 = *pb - *pa;
      dVar9 = pb[1] - pa[1];
      dVar10 = pb[2] - pa[2];
      this_00 = (tetgenmesh *)(long)facpoints->objectbytes;
      lVar4 = 1;
      pdVar5 = (double *)0x0;
      dVar7 = 0.0;
      do {
        pdVar1 = *(double **)
                  (facpoints->toparray[(uint)lVar4 >> ((byte)facpoints->log2objectsperblock & 0x1f)]
                  + (long)(int)((uint)lVar4 & facpoints->objectsperblockmark) * (long)this_00);
        dVar13 = *pdVar1 - *pa;
        dVar11 = pdVar1[1] - pa[1];
        dVar12 = pdVar1[2] - pa[2];
        local_68 = dVar9 * dVar12 - dVar10 * dVar11;
        local_60 = dVar12 * dVar8 - dVar10 * dVar13;
        local_58 = dVar11 * dVar8 - dVar13 * dVar9;
        dVar11 = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
        if (dVar11 <= dVar7) {
          dVar11 = dVar7;
          pdVar1 = pdVar5;
        }
        pdVar5 = pdVar1;
        lVar4 = lVar4 + 1;
        dVar7 = dVar11;
      } while (facpoints->objects != lVar4);
      local_60 = -local_60;
      bVar3 = dVar11 == 0.0;
    }
    if (!bVar3) {
      local_38 = ppb;
      facenormal(this_00,pa,pb,pdVar5,&local_68,1,(double *)0x0);
      dVar7 = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
      if (dVar7 < 0.0) {
        local_40 = local_60;
        local_48 = local_68;
        local_50 = local_58;
        dVar7 = sqrt(dVar7);
        local_60 = local_40;
        local_68 = local_48;
        local_58 = local_50;
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar6 = dVar6 * 0.5;
      pdVar2 = this->dummypoint;
      *pdVar2 = (local_68 / dVar7) * dVar6 + *pa;
      pdVar2[1] = (local_60 / dVar7) * dVar6 + pa[1];
      pdVar2[2] = dVar6 * (local_58 / dVar7) + pa[2];
      if (ppa == (point *)0x0) {
        return true;
      }
      *ppa = pa;
      *local_38 = pb;
      *ppc = pdVar5;
      return true;
    }
    if (this->b->quiet == 0) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
             (ulong)*(uint *)((long)pa + (long)this->pointmarkindex * 4),
             (ulong)*(uint *)((long)pb + (long)this->pointmarkindex * 4));
      return false;
    }
  }
  else if (this->b->quiet == 0) {
    printf("Warning:  All points of a facet are coincident with %d.\n",
           (ulong)*(uint *)((long)pa + (long)this->pointmarkindex * 4));
    return false;
  }
  return false;
}

Assistant:

bool tetgenmesh::calculateabovepoint(arraypool *facpoints, point *ppa,
                                     point *ppb, point *ppc)
{
  point *ppt, pa, pb, pc;
  REAL v1[3], v2[3], n[3];
  REAL lab, len, A, area;
  REAL x, y, z;
  int i;

  ppt = (point *) fastlookup(facpoints, 0);
  pa = *ppt; // a is the first point.
  pb = pc = NULL; // Avoid compiler warnings.

  // Get a point b s.t. the length of [a, b] is maximal.
  lab = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    x = (*ppt)[0] - pa[0];
    y = (*ppt)[1] - pa[1];
    z = (*ppt)[2] - pa[2];
    len = x * x + y * y + z * z;
    if (len > lab) {
      lab = len;
      pb = *ppt;
    }
  }
  lab = sqrt(lab);
  if (lab == 0) {
    if (!b->quiet) {
      printf("Warning:  All points of a facet are coincident with %d.\n",
        pointmark(pa));
    }
    return false;
  }

  // Get a point c s.t. the area of [a, b, c] is maximal.
  v1[0] = pb[0] - pa[0];
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  A = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    v2[0] = (*ppt)[0] - pa[0];
    v2[1] = (*ppt)[1] - pa[1];
    v2[2] = (*ppt)[2] - pa[2];
    cross(v1, v2, n);
    area = dot(n, n);
    if (area > A) {
      A = area;
      pc = *ppt;
    }
  }
  if (A == 0) {
    // All points are collinear. No above point.
    if (!b->quiet) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
        pointmark(pa), pointmark(pb));
    }
    return false;
  }

  // Calculate an above point of this facet.
  facenormal(pa, pb, pc, n, 1, NULL);
  len = sqrt(dot(n, n));
  n[0] /= len;
  n[1] /= len;
  n[2] /= len;
  lab /= 2.0; // Half the maximal length.
  dummypoint[0] = pa[0] + lab * n[0];
  dummypoint[1] = pa[1] + lab * n[1];
  dummypoint[2] = pa[2] + lab * n[2];

  if (ppa != NULL) {
    // Return the three points.
    *ppa = pa;
    *ppb = pb;
    *ppc = pc;
  }

  return true;
}